

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::
write_int_noinline<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned__int128>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,
          write_int_arg<unsigned___int128> arg,basic_format_specs<wchar_t> *specs,locale_ref loc)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 value [16];
  undefined1 n [16];
  undefined1 value_00 [16];
  uint uVar4;
  int iVar5;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar6;
  wchar_t *pwVar7;
  uint *puVar8;
  int *piVar9;
  byte *pbVar10;
  char *pcVar11;
  uint uVar12;
  char *digits;
  ulong uVar13;
  char *pcVar14;
  char *pcVar15;
  detail *pdVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  bool bVar21;
  format_decimal_result<wchar_t_*> fVar22;
  undefined1 in_stack_ffffffffffffff08;
  undefined1 uVar23;
  presentation_type pVar24;
  undefined7 in_stack_ffffffffffffff09;
  undefined7 uVar25;
  write_int_data<wchar_t> local_e8;
  undefined1 local_d8 [40];
  ulong local_b0;
  int local_a8;
  bool local_a4;
  
  pVar24 = specs->type;
  uVar23 = SUB81(specs,0);
  uVar25 = (undefined7)((ulong)specs >> 8);
  switch(pVar24) {
  case none:
  case dec:
    if (((specs->field_0xa & 1) != 0) &&
       (value._1_7_ = in_stack_ffffffffffffff09, value[0] = in_stack_ffffffffffffff08,
       value._8_8_ = out.container,
       bVar20 = write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned__int128,wchar_t>
                          ((detail *)&stack0xffffffffffffff10,
                           (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> *)
                           (detail *)arg.abs_value,(unsigned___int128)value,arg.abs_value._8_4_,
                           (basic_format_specs<wchar_t> *)(ulong)arg.prefix,(locale_ref)specs),
       bVar20)) {
      return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)out.container;
    }
    n._1_7_ = in_stack_ffffffffffffff09;
    n[0] = in_stack_ffffffffffffff08;
    n._8_8_ = out.container;
    iVar5 = count_digits_fallback<unsigned__int128>((detail *)arg.abs_value,(unsigned___int128)n);
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<wchar_t>::write_int_data(&local_e8,iVar5,arg.prefix,specs);
      local_d8._0_4_ = arg.prefix;
      local_d8._8_8_ = local_e8.size;
      local_d8._16_8_ = local_e8.padding;
      local_b0 = arg.abs_value._8_8_;
      local_d8._32_8_ = (detail *)arg.abs_value;
      local_a8 = iVar5;
      bVar6 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,int,unsigned_int,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_&>
                        (out,(basic_format_specs<wchar_t> *)CONCAT71(uVar25,uVar23),local_e8.size,
                         local_e8.size,(anon_class_64_3_4ecd7a16 *)local_d8);
      return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar6.container;
    }
    if (-1 < iVar5) {
      bVar6.container = out.container;
      if ((arg.prefix != 0) &&
         (uVar12 = arg.prefix & 0xffffff,
         ((undefined1  [32])arg & (undefined1  [32])0xffffff) != (undefined1  [32])0x0)) {
        do {
          if ((out.container)->capacity_ < (out.container)->size_ + 1) {
            (**(out.container)->_vptr_buffer)(out.container);
          }
          sVar1 = (out.container)->size_;
          (out.container)->size_ = sVar1 + 1;
          (out.container)->ptr_[sVar1] = uVar12 & 0xff;
          bVar20 = 0xff < uVar12;
          uVar12 = uVar12 >> 8;
        } while (bVar20);
      }
      value_00._1_7_ = in_stack_ffffffffffffff09;
      value_00[0] = in_stack_ffffffffffffff08;
      value_00._8_8_ = bVar6.container;
      fVar22 = format_decimal<wchar_t,unsigned__int128>
                         ((detail *)local_d8,(wchar_t *)(detail *)arg.abs_value,
                          (unsigned___int128)value_00,arg.abs_value._8_4_);
      bVar6 = copy_str_noinline<wchar_t,wchar_t*,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                        ((wchar_t *)local_d8,fVar22.end,out);
      return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar6.container;
    }
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x195,"negative value");
  case oct:
    lVar17 = -4;
    uVar13 = arg.abs_value._8_8_;
    pdVar16 = (detail *)arg.abs_value;
    lVar18 = 0;
    do {
      lVar19 = lVar18;
      uVar2 = uVar13 << 0x3d;
      lVar17 = lVar17 + 4;
      lVar18 = lVar19 + 1;
      bVar20 = (detail *)0x7 < pdVar16;
      bVar21 = uVar13 != 0;
      uVar3 = -uVar13;
      uVar13 = uVar13 >> 3;
      pdVar16 = (detail *)(uVar2 | (ulong)pdVar16 >> 3);
    } while (bVar21 || uVar3 < bVar20);
    iVar5 = (int)lVar18;
    if (((specs->field_0x9 & 0x80) != 0) &&
       (((detail *)arg.abs_value != (detail *)0x0 || arg.abs_value._8_8_ != 0) &&
        specs->precision <= iVar5)) {
      uVar12 = 0x3000;
      if (arg.prefix == 0) {
        uVar12 = 0x30;
      }
      arg.prefix = (uVar12 | arg.prefix) + L'\x01000000';
    }
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<wchar_t>::write_int_data(&local_e8,iVar5,arg.prefix,specs);
      local_d8._8_8_ = local_e8.size;
      local_d8._16_8_ = local_e8.padding;
      local_b0 = arg.abs_value._8_8_;
      local_d8._32_8_ = (detail *)arg.abs_value;
      local_d8._0_4_ = arg.prefix;
      local_a8 = iVar5;
      bVar6 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_4_>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,int,unsigned_int,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_4_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_&>
                        (out,specs,local_e8.size,local_e8.size,(anon_class_64_3_4ecd7a16 *)local_d8)
      ;
      return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar6.container;
    }
    if ((arg.prefix != L'\0') && (uVar12 = arg.prefix & 0xffffff, (arg.prefix & 0xffffff) != 0)) {
      do {
        if ((out.container)->capacity_ < (out.container)->size_ + 1) {
          (**(out.container)->_vptr_buffer)(out.container);
        }
        sVar1 = (out.container)->size_;
        (out.container)->size_ = sVar1 + 1;
        (out.container)->ptr_[sVar1] = uVar12 & 0xff;
        bVar20 = 0xff < uVar12;
        uVar12 = uVar12 >> 8;
      } while (bVar20);
    }
    sVar1 = (out.container)->size_;
    uVar13 = sVar1 + lVar18;
    if ((out.container)->capacity_ < uVar13) {
      pwVar7 = (wchar_t *)0x0;
    }
    else {
      (out.container)->size_ = uVar13;
      pwVar7 = (out.container)->ptr_ + sVar1;
    }
    if (pwVar7 != (wchar_t *)0x0) {
      puVar8 = (uint *)((long)pwVar7 + lVar17);
      do {
        uVar13 = arg.abs_value._8_8_ << 0x3d;
        *puVar8 = (uint)(detail *)arg.abs_value & 7 | 0x30;
        puVar8 = puVar8 + -1;
        bVar20 = ((detail *)arg.abs_value < (detail *)0x8) <= arg.abs_value._8_8_;
        arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 3;
        arg.abs_value._0_8_ = (detail *)(uVar13 | (ulong)(detail *)arg.abs_value >> 3);
      } while (bVar20);
      return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)out.container;
    }
    pbVar10 = local_d8 + lVar19;
    pcVar14 = local_d8 + lVar19 + 1;
    do {
      *pbVar10 = (byte)(detail *)arg.abs_value & 7 | 0x30;
      uVar13 = arg.abs_value._8_8_ << 0x3d;
      pbVar10 = pbVar10 + -1;
      bVar20 = (detail *)0x7 < (detail *)arg.abs_value;
      bVar21 = arg.abs_value._8_8_ != 0;
      uVar2 = -arg.abs_value._8_8_;
      arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 3;
      arg.abs_value._0_8_ = (detail *)(uVar13 | (ulong)(detail *)arg.abs_value >> 3);
    } while (bVar21 || uVar2 < bVar20);
    break;
  case hex_lower:
  case hex_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar4 = (uint)(pVar24 != hex_upper) << 0xd | 0x5830;
      uVar12 = uVar4 << 8;
      if (arg.prefix == 0) {
        uVar12 = uVar4;
      }
      arg.prefix = (uVar12 | arg.prefix) + L'\x02000000';
    }
    lVar17 = -4;
    uVar13 = arg.abs_value._8_8_;
    pdVar16 = (detail *)arg.abs_value;
    lVar18 = 0;
    do {
      lVar19 = lVar18;
      uVar2 = uVar13 << 0x3c;
      lVar17 = lVar17 + 4;
      lVar18 = lVar19 + 1;
      bVar20 = (detail *)0xf < pdVar16;
      bVar21 = uVar13 != 0;
      uVar3 = -uVar13;
      uVar13 = uVar13 >> 4;
      pdVar16 = (detail *)(uVar2 | (ulong)pdVar16 >> 4);
    } while (bVar21 || uVar3 < bVar20);
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<wchar_t>::write_int_data(&local_e8,(int)lVar18,arg.prefix,specs);
      local_d8._8_8_ = local_e8.size;
      local_d8._16_8_ = local_e8.padding;
      local_b0 = arg.abs_value._8_8_;
      local_d8._32_8_ = (detail *)arg.abs_value;
      local_d8._0_4_ = arg.prefix;
      local_a8 = (int)lVar18;
      local_a4 = pVar24 == hex_upper;
      bVar6 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_2_>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,int,unsigned_int,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_2_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_&>
                        (out,(basic_format_specs<wchar_t> *)CONCAT71(uVar25,uVar23),local_e8.size,
                         local_e8.size,(anon_class_64_3_4ecd7a16 *)local_d8);
      return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar6.container;
    }
    if ((arg.prefix != L'\0') && (uVar12 = arg.prefix & 0xffffff, (arg.prefix & 0xffffff) != 0)) {
      do {
        if ((out.container)->capacity_ < (out.container)->size_ + 1) {
          (**(out.container)->_vptr_buffer)(out.container);
        }
        sVar1 = (out.container)->size_;
        (out.container)->size_ = sVar1 + 1;
        (out.container)->ptr_[sVar1] = uVar12 & 0xff;
        bVar20 = 0xff < uVar12;
        uVar12 = uVar12 >> 8;
      } while (bVar20);
    }
    sVar1 = (out.container)->size_;
    uVar13 = sVar1 + lVar18;
    if ((out.container)->capacity_ < uVar13) {
      pwVar7 = (wchar_t *)0x0;
    }
    else {
      (out.container)->size_ = uVar13;
      pwVar7 = (out.container)->ptr_ + sVar1;
    }
    if (pwVar7 != (wchar_t *)0x0) {
      pcVar14 = "0123456789abcdef";
      if (pVar24 == hex_upper) {
        pcVar14 = "0123456789ABCDEF";
      }
      piVar9 = (int *)((long)pwVar7 + lVar17);
      do {
        uVar13 = arg.abs_value._8_8_ << 0x3c;
        *piVar9 = (int)pcVar14[(uint)(detail *)arg.abs_value & 0xf];
        piVar9 = piVar9 + -1;
        bVar20 = ((detail *)arg.abs_value < (detail *)0x10) <= arg.abs_value._8_8_;
        arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 4;
        arg.abs_value._0_8_ = (detail *)(uVar13 | (ulong)(detail *)arg.abs_value >> 4);
      } while (bVar20);
      return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)out.container;
    }
    pcVar11 = local_d8 + lVar19;
    pcVar14 = local_d8 + lVar19 + 1;
    pcVar15 = "0123456789abcdef";
    if (pVar24 == hex_upper) {
      pcVar15 = "0123456789ABCDEF";
    }
    do {
      *pcVar11 = pcVar15[(uint)(detail *)arg.abs_value & 0xf];
      uVar13 = arg.abs_value._8_8_ << 0x3c;
      pcVar11 = pcVar11 + -1;
      bVar20 = (detail *)0xf < (detail *)arg.abs_value;
      bVar21 = arg.abs_value._8_8_ != 0;
      uVar2 = -arg.abs_value._8_8_;
      arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 4;
      arg.abs_value._0_8_ = (detail *)(uVar13 | (ulong)(detail *)arg.abs_value >> 4);
    } while (bVar21 || uVar2 < bVar20);
    break;
  case bin_lower:
  case bin_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar4 = (uint)(pVar24 != bin_upper) << 0xd | 0x4230;
      uVar12 = uVar4 << 8;
      if (arg.prefix == 0) {
        uVar12 = uVar4;
      }
      arg.prefix = (uVar12 | arg.prefix) + L'\x02000000';
    }
    lVar17 = -4;
    uVar13 = arg.abs_value._8_8_;
    pdVar16 = (detail *)arg.abs_value;
    lVar18 = 0;
    do {
      lVar19 = lVar18;
      uVar2 = uVar13 << 0x3f;
      lVar17 = lVar17 + 4;
      lVar18 = lVar19 + 1;
      bVar20 = (detail *)0x1 < pdVar16;
      bVar21 = uVar13 != 0;
      uVar3 = -uVar13;
      uVar13 = uVar13 >> 1;
      pdVar16 = (detail *)(uVar2 | (ulong)pdVar16 >> 1);
    } while (bVar21 || uVar3 < bVar20);
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<wchar_t>::write_int_data(&local_e8,(int)lVar18,arg.prefix,specs);
      local_d8._8_8_ = local_e8.size;
      local_d8._16_8_ = local_e8.padding;
      local_b0 = arg.abs_value._8_8_;
      local_d8._32_8_ = (detail *)arg.abs_value;
      local_d8._0_4_ = arg.prefix;
      local_a8 = (int)lVar18;
      bVar6 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_3_>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,int,unsigned_int,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_3_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_&>
                        (out,specs,local_e8.size,local_e8.size,(anon_class_64_3_4ecd7a16 *)local_d8)
      ;
      return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar6.container;
    }
    if ((arg.prefix != L'\0') && (uVar12 = arg.prefix & 0xffffff, (arg.prefix & 0xffffff) != 0)) {
      do {
        if ((out.container)->capacity_ < (out.container)->size_ + 1) {
          (**(out.container)->_vptr_buffer)(out.container);
        }
        sVar1 = (out.container)->size_;
        (out.container)->size_ = sVar1 + 1;
        (out.container)->ptr_[sVar1] = uVar12 & 0xff;
        bVar20 = 0xff < uVar12;
        uVar12 = uVar12 >> 8;
      } while (bVar20);
    }
    sVar1 = (out.container)->size_;
    uVar13 = sVar1 + lVar18;
    if ((out.container)->capacity_ < uVar13) {
      pwVar7 = (wchar_t *)0x0;
    }
    else {
      (out.container)->size_ = uVar13;
      pwVar7 = (out.container)->ptr_ + sVar1;
    }
    if (pwVar7 != (wchar_t *)0x0) {
      puVar8 = (uint *)((long)pwVar7 + lVar17);
      do {
        uVar13 = arg.abs_value._8_8_ << 0x3f;
        *puVar8 = (uint)(detail *)arg.abs_value & 1 | 0x30;
        puVar8 = puVar8 + -1;
        bVar20 = ((detail *)arg.abs_value < (detail *)0x2) <= arg.abs_value._8_8_;
        arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 1;
        arg.abs_value._0_8_ = (detail *)(uVar13 | (ulong)(detail *)arg.abs_value >> 1);
      } while (bVar20);
      return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)out.container;
    }
    pbVar10 = local_d8 + lVar19;
    pcVar14 = local_d8 + lVar19 + 1;
    do {
      *pbVar10 = (byte)(detail *)arg.abs_value & 1 | 0x30;
      uVar13 = arg.abs_value._8_8_ << 0x3f;
      pbVar10 = pbVar10 + -1;
      bVar20 = (detail *)0x1 < (detail *)arg.abs_value;
      bVar21 = arg.abs_value._8_8_ != 0;
      uVar2 = -arg.abs_value._8_8_;
      arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 1;
      arg.abs_value._0_8_ = (detail *)(uVar13 | (ulong)(detail *)arg.abs_value >> 1);
    } while (bVar21 || uVar2 < bVar20);
    break;
  default:
    fmt::v8::detail::throw_format_error("invalid type specifier");
  case chr:
    local_d8._0_4_ = (undefined4)arg.abs_value;
    bVar6 = write_padded<(fmt::v8::align::type)1,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_char<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::basic_format_specs<wchar_t>const&)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_&>
                      (out,specs,1,1,(anon_class_4_1_a8c68091 *)local_d8);
    return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar6.container;
  }
  bVar6 = copy_str_noinline<wchar_t,char*,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                    (local_d8,pcVar14,out);
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar6.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}